

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseConstant(Ver_Man_t *pMan,char *pWord)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int i;
  int nBits;
  char *pWord_local;
  Ver_Man_t *pMan_local;
  
  if ((*pWord < '1') || ('9' < pWord[1])) {
    __assert_fail("pWord[0] >= \'1\' && pWord[1] <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                  ,0x2f4,"int Ver_ParseConstant(Ver_Man_t *, char *)");
  }
  iVar1 = atoi(pWord);
  _i = pWord;
  while( true ) {
    bVar2 = false;
    if (*_i != '\0') {
      bVar2 = *_i != '\'';
    }
    if (!bVar2) break;
    _i = _i + 1;
  }
  if (*_i == '\0') {
    sprintf(pMan->sError,"Cannot find symbol \' in the constant.");
    Ver_ParsePrintErrorMessage(pMan);
    pMan_local._4_4_ = 0;
  }
  else {
    if (*_i != '\'') {
      __assert_fail("*pWord == \'\\\'\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                    ,0x2ff,"int Ver_ParseConstant(Ver_Man_t *, char *)");
    }
    if (_i[1] == 'b') {
      Vec_PtrClear(pMan->vNames);
      for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
        if (((_i[(long)local_28 + 2] != '0') && (_i[(long)local_28 + 2] != '1')) &&
           (_i[(long)local_28 + 2] != 'x')) {
          sprintf(pMan->sError,"Having problem parsing the binary constant.");
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        if (_i[(long)local_28 + 2] == 'x') {
          Vec_PtrPush(pMan->vNames,(void *)0x0);
        }
        else {
          Vec_PtrPush(pMan->vNames,(void *)(long)(_i[(long)local_28 + 2] + -0x30));
        }
      }
      pMan_local._4_4_ = 1;
    }
    else {
      sprintf(pMan->sError,"Currently can only handle binary constants.");
      Ver_ParsePrintErrorMessage(pMan);
      pMan_local._4_4_ = 0;
    }
  }
  return pMan_local._4_4_;
}

Assistant:

int Ver_ParseConstant( Ver_Man_t * pMan, char * pWord )
{
    int nBits, i;
    assert( pWord[0] >= '1' && pWord[1] <= '9' );
    nBits = atoi(pWord);
    // find the next symbol \'
    while ( *pWord && *pWord != '\'' )
        pWord++;
    if ( *pWord == 0 )
    {
        sprintf( pMan->sError, "Cannot find symbol \' in the constant." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    assert( *pWord == '\'' );
    pWord++;
    if ( *pWord != 'b' )
    {
        sprintf( pMan->sError, "Currently can only handle binary constants." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    pWord++;
    // scan the bits
    Vec_PtrClear( pMan->vNames );
    for ( i = 0; i < nBits; i++ )
    {
      if ( pWord[i] != '0' && pWord[i] != '1' && pWord[i] != 'x' )
      {
         sprintf( pMan->sError, "Having problem parsing the binary constant." );
         Ver_ParsePrintErrorMessage( pMan );
         return 0;
      }
      if ( pWord[i] == 'x' ) 
          Vec_PtrPush( pMan->vNames, (void *)0 );
      else 
          Vec_PtrPush( pMan->vNames, (void *)(ABC_PTRUINT_T)(pWord[i]-'0') );
    }
    return 1;
}